

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

AssertionResult __thiscall
testing::internal::FloatingPointLE<float>
          (internal *this,char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  stringstream val2_ss;
  stringstream val1_ss;
  char *local_3a0;
  char *local_398;
  FloatingPointUnion local_390;
  FloatingPointUnion local_38c;
  string local_388;
  string local_368;
  AssertionResult local_348;
  stringstream local_338 [16];
  long local_328;
  undefined8 auStack_320 [13];
  ios_base aiStack_2b8 [264];
  stringstream local_1b0 [16];
  long local_1a0;
  undefined8 auStack_198 [13];
  ios_base aiStack_130 [264];
  
  if (val2 <= val1) {
    local_3a0 = expr2;
    local_398 = expr1;
    local_390.value_ = val2;
    local_38c.value_ = val1;
    bVar1 = FloatingPoint<float>::AlmostEquals
                      ((FloatingPoint<float> *)&local_38c,(FloatingPoint<float> *)&local_390);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a0 + -0x18)) = 8;
      std::ostream::_M_insert<double>((double)val1);
      std::__cxx11::stringstream::stringstream(local_338);
      *(undefined8 *)((long)auStack_320 + *(long *)(local_328 + -0x18)) = 8;
      std::ostream::_M_insert<double>((double)val2);
      local_348.success_ = false;
      local_348.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_348,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_398);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_3a0);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x17c9d6);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x17c2d4);
      StringStreamToString(&local_368,(stringstream *)local_1b0);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_368);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_388,(stringstream *)local_338);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_388);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p);
      }
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_348.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      std::__cxx11::stringstream::~stringstream(local_338);
      std::ios_base::~ios_base(aiStack_2b8);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(aiStack_130);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_0016f9c7;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_0016f9c7:
  AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}